

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateParsingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = 
    "java.lang.String s = input.readStringRequireUtf8();\n$set_has_field_bit_message$\n$name$_ = s;\n"
    ;
  }
  else {
    text = 
    "com.google.protobuf.ByteString bs = input.readBytes();\n$set_has_field_bit_message$\n$name$_ = bs;\n"
    ;
    if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa2) != '\0') {
      text = 
      "java.lang.String s = input.readStringRequireUtf8();\n$set_has_field_bit_message$\n$name$_ = s;\n"
      ;
    }
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "java.lang.String s = input.readStringRequireUtf8();\n"
      "$set_has_field_bit_message$\n"
      "$name$_ = s;\n");
  } else {
    printer->Print(variables_,
      "com.google.protobuf.ByteString bs = input.readBytes();\n"
      "$set_has_field_bit_message$\n"
      "$name$_ = bs;\n");
  }
}